

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_location_impl.hpp
# Opt level: O0

ostringstream *
toml::detail::format_underline(ostringstream *oss,size_t lnw,size_t col,size_t len,string *msg)

{
  ostream *poVar1;
  void *pvVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  long in_RDX;
  ostream *in_RDI;
  string *in_R8;
  size_t sanitized_col;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  undefined8 in_stack_ffffffffffffff10;
  ostringstream *poVar3;
  char c;
  size_t in_stack_ffffffffffffff18;
  string *len_00;
  long local_d8;
  string local_a0 [32];
  string local_80 [32];
  long local_60;
  string local_48 [32];
  string *local_28;
  long local_18;
  ostringstream *local_8;
  
  local_28 = in_R8;
  local_18 = in_RDX;
  local_8 = (ostringstream *)in_RDI;
  make_string_abi_cxx11_(in_stack_ffffffffffffff18,(char)((ulong)in_stack_ffffffffffffff10 >> 0x38))
  ;
  poVar1 = std::operator<<(in_RDI,local_48);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,color::ansi::bold);
  poVar1 = (ostream *)std::ostream::operator<<(pvVar2,color::ansi::blue);
  poVar1 = std::operator<<(poVar1," | ");
  std::ostream::operator<<(poVar1,color::ansi::reset);
  std::__cxx11::string::~string(in_stack_fffffffffffffee0);
  if (local_18 == 0) {
    local_d8 = 0;
  }
  else {
    local_d8 = local_18 + -1;
  }
  local_60 = local_d8;
  len_00 = local_80;
  poVar3 = local_8;
  make_string_abi_cxx11_((size_t)len_00,(char)((ulong)local_8 >> 0x38));
  poVar1 = std::operator<<((ostream *)poVar3,len_00);
  c = (char)((ulong)poVar3 >> 0x38);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,color::ansi::bold);
  poVar1 = (ostream *)std::ostream::operator<<(pvVar2,color::ansi::red);
  make_string_abi_cxx11_((size_t)len_00,c);
  poVar1 = std::operator<<(poVar1,local_a0);
  poVar1 = std::operator<<(poVar1,"-- ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,color::ansi::reset);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::operator<<(poVar1,local_28);
  std::operator<<((ostream *)this,'\n');
  std::__cxx11::string::~string(this);
  std::__cxx11::string::~string(this);
  return local_8;
}

Assistant:

TOML11_INLINE std::ostringstream& format_underline(std::ostringstream& oss,
        const std::size_t lnw, const std::size_t col, const std::size_t len,
        const std::string& msg)
{
    //    |       ^^^^^^^-- this part
    oss << make_string(lnw + 1, ' ')
        << color::bold << color::blue << " | " << color::reset;

    // in case col is 0, so we don't create a string with size_t max length
    const std::size_t sanitized_col = col == 0 ? 0 : col - 1 /*1-origin*/;
    oss << make_string(sanitized_col, ' ')
        << color::bold << color::red
        << make_string(len, '^') << "-- "
        << color::reset << msg << '\n';

    return oss;
}